

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall Util::Permutation(Util *this,size_t size)

{
  ulong in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> *permutation;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a493);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (uVar1 = 0; uVar1 < in_RDX; uVar1 = uVar1 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(in_RSI,(value_type_conflict1 *)in_RDI);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)permutation,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)size);
  return in_RDI;
}

Assistant:

vector<int> Util::Permutation(size_t size) {
    vector<int> permutation;
    permutation.reserve(size);
    for (size_t i = 0; i < size; i++) permutation.push_back(i);
    shuffle(permutation.begin(), permutation.end(), rng_);
    return permutation;
}